

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::CommitParser::ParsePerson(CommitParser *this,char *str,Person *person)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  char *__nptr;
  char *pcVar7;
  char *local_38;
  
  while ((uVar5 = (uint)*str, uVar5 != 0 && (iVar2 = isspace(uVar5), iVar2 != 0))) {
    str = str + 1;
  }
  lVar4 = 0;
  while (((char)uVar5 != '\0' && ((uVar5 & 0xff) != 0x3c))) {
    lVar6 = lVar4 + 1;
    lVar4 = lVar4 + 1;
    uVar5 = (uint)(byte)str[lVar6];
  }
  __nptr = str + lVar4;
  lVar6 = -lVar4;
  pcVar7 = str + lVar4 + 1;
  local_38 = __nptr;
  do {
    if (lVar6 == 0) break;
    iVar2 = isspace((int)pcVar7[-2]);
    pcVar7 = pcVar7 + -1;
    lVar6 = lVar6 + 1;
  } while (iVar2 != 0);
  std::__cxx11::string::assign((char *)person,(ulong)str);
  pcVar7 = __nptr;
  if (*__nptr != '\0') {
    __nptr = str + lVar4 + 1;
    pcVar7 = __nptr;
  }
  do {
    cVar1 = *__nptr;
    if (cVar1 == '\0') break;
    __nptr = __nptr + 1;
  } while (cVar1 != '>');
  local_38 = __nptr;
  std::__cxx11::string::assign((char *)&person->EMail,(ulong)pcVar7);
  uVar3 = strtoul(__nptr,&local_38,10);
  person->Time = uVar3;
  lVar4 = strtol(local_38,&local_38,10);
  person->TimeZone = lVar4;
  return;
}

Assistant:

void ParsePerson(const char* str, Person& person)
  {
    // Person Name <person@domain.com> 1234567890 +0000
    const char* c = str;
    while (*c && isspace(*c)) {
      ++c;
    }

    const char* name_first = c;
    while (*c && *c != '<') {
      ++c;
    }
    const char* name_last = c;
    while (name_last != name_first && isspace(*(name_last - 1))) {
      --name_last;
    }
    person.Name.assign(name_first, name_last - name_first);

    const char* email_first = *c ? ++c : c;
    while (*c && *c != '>') {
      ++c;
    }
    const char* email_last = *c ? c++ : c;
    person.EMail.assign(email_first, email_last - email_first);

    person.Time = strtoul(c, const_cast<char**>(&c), 10);
    person.TimeZone = strtol(c, const_cast<char**>(&c), 10);
  }